

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NodeFindFanin(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pThis;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pNode_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 <= local_2c) {
      return -1;
    }
    pAVar2 = Abc_ObjFanin(pNode,local_2c);
    if (pAVar2 == pFanin) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Abc_NodeFindFanin( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pThis;
    int i;
    Abc_ObjForEachFanin( pNode, pThis, i )
        if ( pThis == pFanin )
            return i;
    return -1;
}